

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

application * __thiscall cppcms::application::root(application *this)

{
  application *paVar1;
  application *paVar2;
  
  paVar2 = this->root_;
  paVar1 = paVar2->root_;
  if (paVar2 != paVar2->root_) {
    do {
      paVar2 = paVar1;
      this->root_ = paVar2;
      paVar1 = paVar2->root_;
    } while (paVar2->root_ != paVar2);
  }
  return paVar2;
}

Assistant:

application *application::root()
{
	if(root_ == root_->root_)
		return root_;
	do {
		root_ = root_->root_;
	}
	while(root_->root_ != root_);
	return root_;
}